

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id_test.c
# Opt level: O3

void test_set_out_of_range(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  undefined1 local_58 [8];
  nni_id_map m;
  uint32_t id;
  int x;
  
  nni_id_map_init((nni_id_map *)local_58,10,0xd,false);
  nVar1 = nni_id_set((nni_id_map *)local_58,1,(void *)((long)&m.id_entries + 4));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                         ,0xb0,"%s: expected success, got %s (%d)","nni_id_set(&m, 1, &x)",pcVar3,
                         nVar1);
  if (iVar2 != 0) {
    nVar1 = nni_id_set((nni_id_map *)local_58,100,(void *)((long)&m.id_entries + 4));
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                           ,0xb1,"%s: expected success, got %s (%d)","nni_id_set(&m, 100, &x)",
                           pcVar3,nVar1);
    if (iVar2 != 0) {
      nVar1 = nni_id_alloc32((nni_id_map *)local_58,(uint32_t *)&m.id_entries,
                             (void *)((long)&m.id_entries + 4));
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                             ,0xb2,"%s: expected success, got %s (%d)","nni_id_alloc32(&m, &id, &x)"
                             ,pcVar3,nVar1);
      if (iVar2 != 0) {
        acutest_check_((uint)((int)m.id_entries == 10),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                       ,0xb3,"%s","id == 10");
        nni_id_map_fini((nni_id_map *)local_58);
        return;
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_set_out_of_range(void)
{
	nni_id_map m;
	int        x;
	uint32_t   id;

	nni_id_map_init(&m, 10, 13, false);

	// We can insert outside the range forcibly.
	NUTS_PASS(nni_id_set(&m, 1, &x));
	NUTS_PASS(nni_id_set(&m, 100, &x));
	NUTS_PASS(nni_id_alloc32(&m, &id, &x));
	NUTS_TRUE(id == 10);
	nni_id_map_fini(&m);
}